

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall tinyusdz::Path::operator<(Path *this,Path *rhs)

{
  size_type sVar1;
  __type _Var2;
  bool bVar3;
  string sStack_68;
  string local_48;
  
  full_path_name_abi_cxx11_(&sStack_68,this);
  full_path_name_abi_cxx11_(&local_48,rhs);
  _Var2 = std::operator==(&sStack_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&sStack_68);
  if (!_Var2) {
    sVar1 = (rhs->_prim_part)._M_string_length;
    if ((this->_prim_part)._M_string_length == 0) {
      return sVar1 != 0;
    }
    if (sVar1 != 0) {
      bVar3 = LessThan(this,rhs);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool operator<(const Path &rhs) const {
    if (full_path_name() == rhs.full_path_name()) {
      return false;
    }

    if (prim_part().empty() || rhs.prim_part().empty()) {
      return prim_part().empty() && rhs.prim_part().size();
    }

    return LessThan(*this, rhs);
  }